

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slot.cpp
# Opt level: O1

void __thiscall
Slot::Slot(Slot *this,ObjectStore *inObjectStore,CK_SLOT_ID inSlotID,ObjectStoreToken *inToken)

{
  Token *this_00;
  
  this->_vptr_Slot = (_func_int **)&PTR__Slot_0019fd58;
  this->objectStore = inObjectStore;
  this->slotID = inSlotID;
  this_00 = (Token *)operator_new(0x28);
  if (inToken == (ObjectStoreToken *)0x0) {
    Token::Token(this_00);
  }
  else {
    Token::Token(this_00,inToken);
  }
  this->token = this_00;
  return;
}

Assistant:

Slot::Slot(ObjectStore* inObjectStore, CK_SLOT_ID inSlotID, ObjectStoreToken* inToken /* = NULL */)
{
	objectStore = inObjectStore;
	slotID = inSlotID;

	if (inToken != NULL)
	{
		token = new Token(inToken);
	}
	else
	{
		token = new Token();
	}
}